

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

void __thiscall AmstradCPC::CRTCBusHandler::~CRTCBusHandler(CRTCBusHandler *this)

{
  CRTCBusHandler *this_local;
  
  std::array<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_4UL>::~array
            (&this->mode3_palette_hits_);
  std::array<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_4UL>::~array
            (&this->mode1_palette_hits_);
  std::array<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_16UL>::~array
            (&this->mode0_palette_hits_);
  Outputs::CRT::CRT::~CRT(&this->crt_);
  return;
}

Assistant:

CRTCBusHandler(const uint8_t *ram, InterruptTimer &interrupt_timer) :
			crt_(1024, 1, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red2Green2Blue2),
			ram_(ram),
			interrupt_timer_(interrupt_timer) {
				establish_palette_hits();
				build_mode_table();
				crt_.set_visible_area(Outputs::Display::Rect(0.1072f, 0.1f, 0.842105263157895f, 0.842105263157895f));
				crt_.set_brightness(3.0f / 2.0f);	// As only the values 0, 1 and 2 will be used in each channel,
													// whereas Red2Green2Blue2 defines a range of 0-3.
			}